

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::PrintfFormatter<wchar_t>::format
          (PrintfFormatter<wchar_t> *this,Arg *writer,wchar_t *param_3)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  bool bVar3;
  uint uVar4;
  FormatError *this_00;
  Arg *pAVar5;
  wchar_t *s;
  Arg *local_80;
  FormatSpec *local_78;
  FormatSpec local_70;
  Arg arg;
  
  s = param_3;
  do {
    while( true ) {
      do {
        pwVar2 = s;
        wVar1 = *s;
        if (wVar1 == L'\0') {
          FormatterBase::write<wchar_t>
                    ((FormatterBase *)this,(BasicWriter<wchar_t> *)writer,param_3,s);
          return;
        }
        s = s + 1;
      } while (wVar1 != L'%');
      if (*s != L'%') break;
      FormatterBase::write<wchar_t>((FormatterBase *)this,(BasicWriter<wchar_t> *)writer,param_3,s);
      param_3 = s + 1;
      s = param_3;
    }
    FormatterBase::write<wchar_t>
              ((FormatterBase *)this,(BasicWriter<wchar_t> *)writer,param_3,pwVar2);
    local_70.super_AlignSpec.super_WidthSpec.width_ = 0;
    local_70.super_AlignSpec.super_WidthSpec.fill_ = L' ';
    local_70.super_AlignSpec.align_ = ALIGN_RIGHT;
    local_70.flags_ = 0;
    local_70.precision_ = 0xffffffff;
    local_70.type_ = '\0';
    uVar4 = parse_header(this,&s,&local_70);
    pwVar2 = s;
    if (*s == L'.') {
      if ((uint)(s[1] + L'\xffffffd0') < 10) {
        s = s + 1;
        local_70.precision_ = parse_nonnegative_int<wchar_t>(&s);
        pwVar2 = s;
      }
      else {
        pwVar2 = s + 1;
        if (s[1] == L'*') {
          s = s + 2;
          pAVar5 = (Arg *)this;
          get_arg(&arg,this,s,0xffffffff);
          local_70.precision_ =
               ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
                         ((ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *)&arg,
                          pAVar5);
          pwVar2 = s;
        }
      }
    }
    s = pwVar2;
    pAVar5 = (Arg *)this;
    get_arg(&arg,this,s,uVar4);
    uVar4 = local_70.flags_;
    if (((local_70._8_8_ & 0x800000000) != 0) &&
       (bVar3 = ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool>::visit
                          ((ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool> *)&arg,pAVar5),
       bVar3)) {
      local_70._8_8_ = CONCAT44(uVar4,local_70.super_AlignSpec.align_) & 0xfffffff7ffffffff;
    }
    if (local_70.super_AlignSpec.super_WidthSpec.fill_ == L'0') {
      if ((int)arg.type < 10) {
        local_70.super_AlignSpec.align_ = 4;
      }
      else {
        local_70.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      }
    }
    pwVar2 = s + 1;
    wVar1 = *s;
    if (wVar1 != L'L') {
      if (wVar1 == L'z') {
        local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,*pwVar2);
        s = pwVar2;
        local_80 = &arg;
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void> *)
                   &local_80,&arg);
        pwVar2 = s;
      }
      else if (wVar1 == L'j') {
LAB_0014f6da:
        wVar1 = *pwVar2;
LAB_0014f6e5:
        local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,wVar1);
        s = pwVar2;
        local_80 = &arg;
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_80,
                   &arg);
        pwVar2 = s;
      }
      else if (wVar1 == L'l') {
        wVar1 = *pwVar2;
        if (wVar1 != L'l') goto LAB_0014f6e5;
        local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,s[2]);
        s = s + 2;
        local_80 = &arg;
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void> *)
                   &local_80,&arg);
        pwVar2 = s;
      }
      else {
        if (wVar1 == L't') goto LAB_0014f6da;
        if (wVar1 == L'h') {
          if (*pwVar2 == L'h') {
            local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,s[2]);
            s = s + 2;
            local_80 = &arg;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void> *)
                       &local_80,&arg);
            pwVar2 = s;
          }
          else {
            local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,*pwVar2);
            s = pwVar2;
            local_80 = &arg;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *)
                       &local_80,&arg);
            pwVar2 = s;
          }
        }
        else {
          local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,wVar1);
          local_80 = &arg;
          ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void>::visit
                    ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void> *)&local_80,
                     &arg);
          pwVar2 = s;
        }
      }
    }
    s = pwVar2;
    wVar1 = *s;
    if (wVar1 == L'\0') {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x156540);
      __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
    }
    s = s + 1;
    local_70.type_ = (char)wVar1;
    if ((int)arg.type < 8) {
      if (local_70.type_ == 'c') {
        local_80 = &arg;
        ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)&local_80,&arg);
      }
      else if ((local_70.type_ == 'u') || (local_70.type_ == 'i')) {
        local_70.type_ = 'd';
      }
    }
    param_3 = s;
    local_78 = &local_70;
    local_80 = writer;
    ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void>::visit
              ((ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void> *)&local_80,&arg);
  } while( true );
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::format(
    BasicWriter<Char> &writer, BasicCStringRef<Char> format_str) {
  const Char *start = format_str.c_str();
  const Char *s = start;
  while (*s) {
    Char c = *s++;
    if (c != '%') continue;
    if (*s == c) {
      write(writer, start, s);
      start = ++s;
      continue;
    }
    write(writer, start, s - 1);

    FormatSpec spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(s, spec);

    // Parse precision.
    if (*s == '.') {
      ++s;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = static_cast<int>(parse_nonnegative_int(s));
      } else if (*s == '*') {
        ++s;
        spec.precision_ = fmt::PrecisionHandler().visit(get_arg(s));
      }
    }

    Arg arg = get_arg(s, arg_index);
    if (spec.flag(HASH_FLAG) && fmt::IsZeroInt().visit(arg))
      spec.flags_ &= ~to_unsigned<int>(HASH_FLAG);
    if (spec.fill_ == '0') {
      if (arg.type <= Arg::LAST_NUMERIC_TYPE)
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    switch (*s++) {
    case 'h':
      if (*s == 'h')
        fmt::ArgConverter<signed char>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<short>(arg, *s).visit(arg);
      break;
    case 'l':
      if (*s == 'l')
        fmt::ArgConverter<fmt::LongLong>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<long>(arg, *s).visit(arg);
      break;
    case 'j':
      fmt::ArgConverter<intmax_t>(arg, *s).visit(arg);
      break;
    case 'z':
      fmt::ArgConverter<std::size_t>(arg, *s).visit(arg);
      break;
    case 't':
      fmt::ArgConverter<std::ptrdiff_t>(arg, *s).visit(arg);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --s;
      fmt::ArgConverter<void>(arg, *s).visit(arg);
    }

    // Parse type.
    if (!*s)
      FMT_THROW(FormatError("invalid format string"));
    spec.type_ = static_cast<char>(*s++);
    if (arg.type <= Arg::LAST_INTEGER_TYPE) {
      // Normalize type.
      switch (spec.type_) {
      case 'i': case 'u':
        spec.type_ = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t
        fmt::CharConverter(arg).visit(arg);
        break;
      }
    }

    start = s;

    // Format argument.
    internal::PrintfArgFormatter<Char>(writer, spec).visit(arg);
  }
  write(writer, start, s);
}